

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int soplex::deQueueMin(int *heap,int *size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int e2;
  int e1;
  int s;
  int j;
  int i;
  int elem;
  int e;
  int *size_local;
  int *heap_local;
  
  iVar1 = *heap;
  iVar2 = *size;
  iVar5 = iVar2 + -1;
  *size = iVar5;
  iVar5 = heap[iVar5];
  j = 0;
  i = 1;
  do {
    if (iVar2 + -2 <= i) {
      if ((i < *size) && (heap[i] < iVar5)) {
        heap[j] = heap[i];
        j = i;
      }
      heap[j] = iVar5;
      return iVar1;
    }
    iVar3 = heap[i];
    iVar4 = heap[i + 1];
    if (iVar3 < iVar4) {
      if (iVar5 <= iVar3) {
        heap[j] = iVar5;
        return iVar1;
      }
      heap[j] = iVar3;
      j = i;
    }
    else {
      if (iVar5 <= iVar4) {
        heap[j] = iVar5;
        return iVar1;
      }
      heap[j] = iVar4;
      j = i + 1;
    }
    i = j * 2 + 1;
  } while( true );
}

Assistant:

static inline int deQueueMin(int* heap, int* size)
{
   int e, elem;
   int i, j, s;
   int e1, e2;

   elem = *heap;
   e = heap[s = --(*size)];
   --s;

   for(j = 0, i = 1; i < s; i = 2 * j + 1)
   {
      e1 = heap[i];
      e2 = heap[i + 1];

      if(e1 < e2)
      {
         if(e > e1)
         {
            heap[j] = e1;
            j = i;
         }
         else
         {
            heap[j] = e;
            return elem;
         }
      }
      else
      {
         if(e > e2)
         {
            heap[j] = e2;
            j = i + 1;
         }
         else
         {
            heap[j] = e;
            return elem;
         }
      }
   }

   if(i < *size && e > heap[i])
   {
      heap[j] = heap[i];
      j = i;
   }

   heap[j] = e;

   return elem;
}